

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O2

void __thiscall
chrono::ChIntegrableIIorder::StateGather(ChIntegrableIIorder *this,ChState *y,double *T)

{
  int iVar1;
  ChStateDelta mv;
  ChState mx;
  ChStateDelta local_80;
  ChState local_68;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_50;
  
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])();
  ChState::ChState(&local_68,(long)iVar1,y->integrable);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_80,(long)iVar1,y->integrable);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x16])(this,&local_68,&local_80,T);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_50,&y->super_ChVectorDynamic<double>,0,
             local_68.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_50.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             &local_68.super_ChVectorDynamic<double>);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            (&local_50,&y->super_ChVectorDynamic<double>,(long)iVar1,
             local_80.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_50.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
             &local_80.super_ChVectorDynamic<double>);
  Eigen::internal::handmade_aligned_free
            (local_80.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_68.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChIntegrableIIorder::StateGather(ChState& y, double& T)  {
    ChState mx(GetNcoords_x(), y.GetIntegrable());
    ChStateDelta mv(GetNcoords_v(), y.GetIntegrable());
    StateGather(mx, mv, T);
    y.segment(0, mx.size()) = mx;
    y.segment(GetNcoords_x(), mv.size()) = mv;
}